

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::CalcListClipping
               (int items_count,float items_height,int *out_items_display_start,
               int *out_items_display_end)

{
  float fVar1;
  ImGuiContext *pIVar2;
  int mn;
  int iVar3;
  ImGuiWindow *pIVar4;
  int end;
  int start;
  ImVec2 pos;
  ImGuiWindow *window;
  ImGuiContext *g;
  int *out_items_display_end_local;
  int *out_items_display_start_local;
  float items_height_local;
  int items_count_local;
  
  pIVar2 = GImGui;
  pIVar4 = GetCurrentWindowRead();
  if ((pIVar2->LogEnabled & 1U) == 0) {
    if ((pIVar4->SkipItems & 1U) == 0) {
      start = (int)(pIVar4->DC).CursorPos.y;
      fVar1 = (pIVar4->ClipRect).Max.y;
      mn = ImClamp((int)(((pIVar4->ClipRect).Min.y - (float)start) / items_height),0,items_count);
      iVar3 = ImClamp((int)((fVar1 - (float)start) / items_height) + 1,mn,items_count);
      *out_items_display_start = mn;
      *out_items_display_end = iVar3;
    }
    else {
      *out_items_display_end = 0;
      *out_items_display_start = 0;
    }
  }
  else {
    *out_items_display_start = 0;
    *out_items_display_end = items_count;
  }
  return;
}

Assistant:

void ImGui::CalcListClipping(int items_count, float items_height, int* out_items_display_start, int* out_items_display_end)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindowRead();
    if (g.LogEnabled)
    {
        // If logging is active, do not perform any clipping
        *out_items_display_start = 0;
        *out_items_display_end = items_count;
        return;
    }
    if (window->SkipItems)
    {
        *out_items_display_start = *out_items_display_end = 0;
        return;
    }

    const ImVec2 pos = window->DC.CursorPos;
    int start = (int)((window->ClipRect.Min.y - pos.y) / items_height);
    int end = (int)((window->ClipRect.Max.y - pos.y) / items_height);
    start = ImClamp(start, 0, items_count);
    end = ImClamp(end + 1, start, items_count);
    *out_items_display_start = start;
    *out_items_display_end = end;
}